

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

char * ures_getVersionNumberInternal_63(UResourceBundle *resourceBundle)

{
  UChar *us;
  char *cs;
  uint uVar1;
  int32_t minor_len;
  UErrorCode status;
  uint local_20 [2];
  
  if (resourceBundle != (UResourceBundle *)0x0) {
    cs = resourceBundle->fVersion;
    if (cs == (char *)0x0) {
      local_20[1] = 0;
      local_20[0] = 0;
      us = ures_getStringByKey_63
                     (resourceBundle,"Version",(int32_t *)local_20,(UErrorCode *)(local_20 + 1));
      uVar1 = 1;
      if (1 < (int)local_20[0]) {
        uVar1 = local_20[0];
      }
      cs = (char *)uprv_malloc_63((ulong)(uVar1 + 1));
      resourceBundle->fVersion = cs;
      if (cs == (char *)0x0) {
        cs = (char *)0x0;
      }
      else if ((int)local_20[0] < 1) {
        cs[0] = '0';
        cs[1] = '\0';
      }
      else {
        u_UCharsToChars_63(us,cs,local_20[0]);
        resourceBundle->fVersion[uVar1] = '\0';
        cs = resourceBundle->fVersion;
      }
    }
    return cs;
  }
  return (char *)0x0;
}

Assistant:

U_INTERNAL const char* U_EXPORT2 
ures_getVersionNumberInternal(const UResourceBundle *resourceBundle)
{
    if (!resourceBundle) return NULL;

    if(resourceBundle->fVersion == NULL) {

        /* If the version ID has not been built yet, then do so.  Retrieve */
        /* the minor version from the file. */
        UErrorCode status = U_ZERO_ERROR;
        int32_t minor_len = 0;
        int32_t len;

        const UChar* minor_version = ures_getStringByKey(resourceBundle, kVersionTag, &minor_len, &status);
        
        /* Determine the length of of the final version string.  This is */
        /* the length of the major part + the length of the separator */
        /* (==1) + the length of the minor part (+ 1 for the zero byte at */
        /* the end). */

        len = (minor_len > 0) ? minor_len : 1;
    
        /* Allocate the string, and build it up. */
        /* + 1 for zero byte */


        ((UResourceBundle *)resourceBundle)->fVersion = (char *)uprv_malloc(1 + len); 
        /* Check for null pointer. */
        if (((UResourceBundle *)resourceBundle)->fVersion == NULL) {
            return NULL;
        }
       
        if(minor_len > 0) {
            u_UCharsToChars(minor_version, resourceBundle->fVersion , minor_len);
            resourceBundle->fVersion[len] =  '\0';
        }
        else {
            uprv_strcpy(resourceBundle->fVersion, kDefaultMinorVersion);
        }
    }

    return resourceBundle->fVersion;
}